

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyi_generator.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::python::PyiGenerator::PrintImports(PyiGenerator *this)

{
  Printer *pPVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  FileDescriptor *this_00;
  FileDescriptor *desc;
  Descriptor *pDVar6;
  EnumDescriptor *this_01;
  string_view sVar7;
  string_view filename;
  string_view local_338;
  string_view local_328;
  string_view local_318;
  int local_304;
  undefined1 auStack_300 [4];
  int i_4;
  char *local_2f8;
  string_view local_2f0;
  int local_2dc;
  undefined1 auStack_2d8 [4];
  int i_3;
  char *local_2d0;
  undefined1 local_2c8 [8];
  string module_name;
  FileDescriptor *public_dep;
  undefined1 auStack_298 [4];
  int i_2;
  string_view local_288;
  string_view local_278;
  string_view local_268;
  string_view local_258;
  string_view local_248;
  string_view local_238;
  string_view local_228;
  string_view local_218;
  string_view local_208;
  string_view local_1f8;
  string_view local_1e8;
  string_view local_1d8;
  string local_1c8;
  string_view local_1a8;
  string local_198;
  string_view local_178;
  string local_168;
  string_view local_148;
  string local_138;
  string_view local_118;
  string local_108;
  string_view local_e8;
  string local_d8;
  string_view local_b8;
  string local_a8;
  string_view local_88;
  int local_74;
  undefined1 local_6e [2];
  int i_1;
  bool local_68;
  bool local_67;
  ImportModules import_modules;
  int j;
  FileDescriptor *dep;
  int local_38;
  bool local_31;
  int i;
  bool has_importlib;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seen_aliases;
  PyiGenerator *this_local;
  
  seen_aliases.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.slot_array = (MaybeInitializedPtr)this;
  absl::lts_20250127::
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::flat_hash_set((flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&i);
  local_31 = false;
  local_38 = 0;
  do {
    iVar4 = FileDescriptor::dependency_count(this->file_);
    if (iVar4 <= local_38) {
      ImportModules::ImportModules((ImportModules *)local_6e);
      iVar4 = FileDescriptor::message_type_count(this->file_);
      if (0 < iVar4) {
        i_1._0_1_ = 1;
      }
      iVar4 = FileDescriptor::enum_type_count(this->file_);
      if (0 < iVar4) {
        i_1._1_1_ = 1;
      }
      if (((this->opensource_runtime_ & 1U) == 0) &&
         (iVar4 = FileDescriptor::service_count(this->file_), 0 < iVar4)) {
        import_modules.has_repeated = true;
        local_68 = true;
        local_67 = true;
      }
      for (local_74 = 0; iVar4 = local_74, iVar5 = FileDescriptor::message_type_count(this->file_),
          iVar4 < iVar5; local_74 = local_74 + 1) {
        pDVar6 = FileDescriptor::message_type(this->file_,local_74);
        CheckImportModules(pDVar6,(ImportModules *)local_6e);
      }
      if ((local_6e[0] & 1U) != 0) {
        pPVar1 = this->printer_;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_88,"from $internal_package$ import containers as _containers\n");
        InternalPackage_abi_cxx11_(&local_a8,this);
        io::Printer::Print<char[17],std::__cxx11::string>
                  (pPVar1,local_88,(char (*) [17])"internal_package",&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
      }
      if ((i_1._1_1_ & 1) != 0) {
        pPVar1 = this->printer_;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_b8,
                   "from $internal_package$ import enum_type_wrapper as _enum_type_wrapper\n");
        InternalPackage_abi_cxx11_(&local_d8,this);
        io::Printer::Print<char[17],std::__cxx11::string>
                  (pPVar1,local_b8,(char (*) [17])"internal_package",&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
      }
      if ((i_1._2_1_ & 1) != 0) {
        pPVar1 = this->printer_;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_e8,"from $internal_package$ import python_message as _python_message\n");
        InternalPackage_abi_cxx11_(&local_108,this);
        io::Printer::Print<char[17],std::__cxx11::string>
                  (pPVar1,local_e8,(char (*) [17])"internal_package",&local_108);
        std::__cxx11::string::~string((string *)&local_108);
      }
      if ((import_modules.has_iterable & 1U) != 0) {
        pPVar1 = this->printer_;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_118,
                   "from $internal_package$ import well_known_types as _well_known_types\n");
        InternalPackage_abi_cxx11_(&local_138,this);
        io::Printer::Print<char[17],std::__cxx11::string>
                  (pPVar1,local_118,(char (*) [17])"internal_package",&local_138);
        std::__cxx11::string::~string((string *)&local_138);
      }
      pPVar1 = this->printer_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_148,"from $public_package$ import descriptor as _descriptor\n");
      PublicPackage_abi_cxx11_(&local_168,this);
      io::Printer::Print<char[15],std::__cxx11::string>
                (pPVar1,local_148,(char (*) [15])"public_package",&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      if (((byte)i_1 & 1) != 0) {
        pPVar1 = this->printer_;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_178,"from $public_package$ import message as _message\n");
        PublicPackage_abi_cxx11_(&local_198,this);
        io::Printer::Print<char[15],std::__cxx11::string>
                  (pPVar1,local_178,(char (*) [15])"public_package",&local_198);
        std::__cxx11::string::~string((string *)&local_198);
      }
      if ((this->opensource_runtime_ & 1U) == 0) {
        iVar4 = FileDescriptor::service_count(this->file_);
        if (0 < iVar4) {
          pPVar1 = this->printer_;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_1d8,
                     "from google3.net.rpc.python import proto_python_api_2_stub as _proto_python_api_2_stub\nfrom google3.net.rpc.python import pywraprpc as _pywraprpc\nfrom google3.net.rpc.python import rpcserver as _rpcserver\n"
                    );
          io::Printer::Print<>(pPVar1,local_1d8);
        }
      }
      else {
        bVar3 = HasGenericServices(this->file_);
        if (bVar3) {
          pPVar1 = this->printer_;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_1a8,"from $public_package$ import service as _service\n");
          PublicPackage_abi_cxx11_(&local_1c8,this);
          io::Printer::Print<char[15],std::__cxx11::string>
                    (pPVar1,local_1a8,(char (*) [15])"public_package",&local_1c8);
          std::__cxx11::string::~string((string *)&local_1c8);
        }
      }
      if (((local_6e[1] & 1U) != 0) || ((i_1._3_1_ & 1) != 0)) {
        pPVar1 = this->printer_;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_1e8,"from collections.abc import");
        io::Printer::Print<>(pPVar1,local_1e8);
        if ((local_6e[1] & 1U) != 0) {
          pPVar1 = this->printer_;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_1f8," Iterable as _Iterable");
          io::Printer::Print<>(pPVar1,local_1f8);
          if ((i_1._3_1_ & 1) != 0) {
            pPVar1 = this->printer_;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_208,",")
            ;
            io::Printer::Print<>(pPVar1,local_208);
          }
        }
        if ((i_1._3_1_ & 1) != 0) {
          pPVar1 = this->printer_;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_218," Mapping as _Mapping");
          io::Printer::Print<>(pPVar1,local_218);
        }
        pPVar1 = this->printer_;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_228,"\n");
        io::Printer::Print<>(pPVar1,local_228);
      }
      pPVar1 = this->printer_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_238,"from typing import ");
      io::Printer::Print<>(pPVar1,local_238);
      if (((this->opensource_runtime_ & 1U) == 0) &&
         (iVar4 = FileDescriptor::service_count(this->file_), 0 < iVar4)) {
        pPVar1 = this->printer_;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_248,"Any as _Any, ");
        io::Printer::Print<>(pPVar1,local_248);
      }
      if ((import_modules.has_repeated & 1U) != 0) {
        pPVar1 = this->printer_;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_258,"Callable as _Callable, ");
        io::Printer::Print<>(pPVar1,local_258);
      }
      pPVar1 = this->printer_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_268,"ClassVar as _ClassVar");
      io::Printer::Print<>(pPVar1,local_268);
      if ((local_68 & 1U) != 0) {
        pPVar1 = this->printer_;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_278,", Optional as _Optional");
        io::Printer::Print<>(pPVar1,local_278);
      }
      if ((local_67 & 1U) != 0) {
        pPVar1 = this->printer_;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_288,", Union as _Union");
        io::Printer::Print<>(pPVar1,local_288);
      }
      pPVar1 = this->printer_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_298,"\n");
      io::Printer::Print<>(pPVar1,_auStack_298);
      public_dep._4_4_ = 0;
      while( true ) {
        iVar4 = FileDescriptor::public_dependency_count(this->file_);
        if (iVar4 <= public_dep._4_4_) break;
        module_name.field_2._8_8_ = FileDescriptor::public_dependency(this->file_,public_dep._4_4_);
        sVar7 = FileDescriptor::name((FileDescriptor *)module_name.field_2._8_8_);
        filename._M_len = sVar7._M_str;
        filename._M_str = (char *)sVar7._M_len;
        _auStack_2d8 = sVar7;
        StrippedModuleName_abi_cxx11_((string *)local_2c8,(python *)sVar7._M_len,filename);
        local_2dc = 0;
        while( true ) {
          iVar4 = local_2dc;
          iVar5 = FileDescriptor::message_type_count((FileDescriptor *)module_name.field_2._8_8_);
          if (iVar5 <= iVar4) break;
          pPVar1 = this->printer_;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_2f0,"from $module$ import $message_class$ as $message_class$\n");
          pDVar6 = FileDescriptor::message_type
                             ((FileDescriptor *)module_name.field_2._8_8_,local_2dc);
          sVar7 = Descriptor::name(pDVar6);
          _auStack_300 = sVar7;
          io::Printer::
          Print<char[7],std::__cxx11::string,char[14],std::basic_string_view<char,std::char_traits<char>>>
                    (pPVar1,local_2f0,(char (*) [7])0xa29477,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8,
                     (char (*) [14])0xacbfca,
                     (basic_string_view<char,_std::char_traits<char>_> *)auStack_300);
          local_2dc = local_2dc + 1;
        }
        local_304 = 0;
        while( true ) {
          iVar4 = local_304;
          iVar5 = FileDescriptor::enum_type_count((FileDescriptor *)module_name.field_2._8_8_);
          if (iVar5 <= iVar4) break;
          pPVar1 = this->printer_;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_318,"from $module$ import $enum_class$ as $enum_class$\n");
          this_01 = FileDescriptor::enum_type((FileDescriptor *)module_name.field_2._8_8_,local_304)
          ;
          sVar7 = EnumDescriptor::name(this_01);
          local_328 = sVar7;
          io::Printer::
          Print<char[7],std::__cxx11::string,char[11],std::basic_string_view<char,std::char_traits<char>>>
                    (pPVar1,local_318,(char (*) [7])0xa29477,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8,
                     (char (*) [11])0xb0b353,&local_328);
          local_304 = local_304 + 1;
        }
        std::__cxx11::string::~string((string *)local_2c8);
        public_dep._4_4_ = public_dep._4_4_ + 1;
      }
      pPVar1 = this->printer_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_338,"\n");
      io::Printer::Print<>(pPVar1,local_338);
      absl::lts_20250127::
      flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~flat_hash_set((flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&i);
      return;
    }
    this_00 = FileDescriptor::dependency(this->file_,local_38);
    if ((this->strip_nonfunctional_codegen_ & 1U) == 0) {
LAB_0026eb6d:
      PrintImportForDescriptor
                (this,this_00,
                 (flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&i,&local_31);
      import_modules.has_messages = false;
      import_modules.has_enums = false;
      import_modules.has_extendable = false;
      import_modules.has_mapping = false;
      for (; uVar2 = import_modules._2_4_, iVar4 = FileDescriptor::public_dependency_count(this_00),
          (int)uVar2 < iVar4; import_modules._2_4_ = import_modules._2_4_ + 1) {
        desc = FileDescriptor::public_dependency(this_00,import_modules._2_4_);
        PrintImportForDescriptor
                  (this,desc,
                   (flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&i,&local_31);
      }
    }
    else {
      sVar7 = FileDescriptor::name(this_00);
      register0x00000000 = (compiler *)sVar7._M_len;
      sVar7._M_len = (size_t)sVar7._M_str;
      bVar3 = IsKnownFeatureProto(register0x00000000,sVar7);
      if (!bVar3) goto LAB_0026eb6d;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void PyiGenerator::PrintImports() const {
  // Prints imported dependent _pb2 files.
  absl::flat_hash_set<std::string> seen_aliases;
  bool has_importlib = false;
  for (int i = 0; i < file_->dependency_count(); ++i) {
    const FileDescriptor* dep = file_->dependency(i);
    if (strip_nonfunctional_codegen_ && IsKnownFeatureProto(dep->name())) {
      continue;
    }
    PrintImportForDescriptor(*dep, &seen_aliases, &has_importlib);
    for (int j = 0; j < dep->public_dependency_count(); ++j) {
      PrintImportForDescriptor(*dep->public_dependency(j), &seen_aliases,
                               &has_importlib);
    }
  }

  // Checks what modules should be imported.
  ImportModules import_modules;
  if (file_->message_type_count() > 0) {
    import_modules.has_messages = true;
  }
  if (file_->enum_type_count() > 0) {
    import_modules.has_enums = true;
  }
  if (!opensource_runtime_ && file_->service_count() > 0) {
    import_modules.has_callable = true;
    import_modules.has_optional = true;
    import_modules.has_union = true;
  }
  for (int i = 0; i < file_->message_type_count(); i++) {
    CheckImportModules(file_->message_type(i), &import_modules);
  }

  // Prints modules (e.g. _containers, _messages, typing) that are
  // required in the proto file.
  if (import_modules.has_repeated) {
    printer_->Print(
        "from $internal_package$ import containers as _containers\n",
        "internal_package", InternalPackage());
  }
  if (import_modules.has_enums) {
    printer_->Print(
        "from $internal_package$ import enum_type_wrapper as "
        "_enum_type_wrapper\n",
        "internal_package", InternalPackage());
  }
  if (import_modules.has_extendable) {
    printer_->Print(
        "from $internal_package$ import python_message as _python_message\n",
        "internal_package", InternalPackage());
  }
  if (import_modules.has_well_known_type) {
    printer_->Print(
        "from $internal_package$ import well_known_types as "
        "_well_known_types\n",
        "internal_package", InternalPackage());
  }
  printer_->Print("from $public_package$ import descriptor as _descriptor\n",
                  "public_package", PublicPackage());
  if (import_modules.has_messages) {
    printer_->Print("from $public_package$ import message as _message\n",
                    "public_package", PublicPackage());
  }
  if (opensource_runtime_) {
    if (HasGenericServices(file_)) {
      printer_->Print("from $public_package$ import service as _service\n",
                      "public_package", PublicPackage());
    }
  } else {
    if (file_->service_count() > 0) {
      printer_->Print(
          "from google3.net.rpc.python import proto_python_api_2_stub as "
          "_proto_python_api_2_stub\n"
          "from google3.net.rpc.python import pywraprpc as _pywraprpc\n"
          "from google3.net.rpc.python import rpcserver as _rpcserver\n");
    }
  }
  if (import_modules.has_iterable || import_modules.has_mapping) {
    printer_->Print("from collections.abc import");
    if (import_modules.has_iterable) {
      printer_->Print(" Iterable as _Iterable");
      if (import_modules.has_mapping) {
        printer_->Print(",");
      }
    }
    if (import_modules.has_mapping) {
      printer_->Print(" Mapping as _Mapping");
    }
    printer_->Print("\n");
  }
  printer_->Print("from typing import ");
  if (!opensource_runtime_ && file_->service_count() > 0) {
    printer_->Print("Any as _Any, ");
  }
  if (import_modules.has_callable) {
    printer_->Print("Callable as _Callable, ");
  }
  printer_->Print("ClassVar as _ClassVar");
  if (import_modules.has_optional) {
    printer_->Print(", Optional as _Optional");
  }
  if (import_modules.has_union) {
    printer_->Print(", Union as _Union");
  }
  printer_->Print("\n");

  // Public imports
  for (int i = 0; i < file_->public_dependency_count(); ++i) {
    const FileDescriptor* public_dep = file_->public_dependency(i);
    std::string module_name = StrippedModuleName(public_dep->name());
    // Top level messages in public imports
    for (int i = 0; i < public_dep->message_type_count(); ++i) {
      printer_->Print(
          "from $module$ import $message_class$ as $message_class$\n", "module",
          module_name, "message_class", public_dep->message_type(i)->name());
    }
    // Top level enums for public imports
    for (int i = 0; i < public_dep->enum_type_count(); ++i) {
      printer_->Print("from $module$ import $enum_class$ as $enum_class$\n",
                      "module", module_name, "enum_class",
                      public_dep->enum_type(i)->name());
    }
  }
  printer_->Print("\n");
}